

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O0

int SendDataRequestSeanet(SEANET *pSeanet)

{
  int iVar1;
  uint8 local_38 [8];
  uchar reqbuf [18];
  SEANET *pSeanet_local;
  
  builtin_memcpy(local_38,"@000C\f",7);
  local_38[7] = 0xff;
  reqbuf[0] = '\x02';
  reqbuf[1] = '\a';
  reqbuf[2] = '\x19';
  reqbuf[3] = 0x80;
  reqbuf[4] = '\x02';
  reqbuf[5] = '\0';
  reqbuf[6] = '\0';
  reqbuf[7] = '\0';
  reqbuf[8] = '\0';
  reqbuf[9] = '\n';
  iVar1 = WriteAllRS232Port(&pSeanet->RS232Port,local_38,0x12);
  if (iVar1 != 0) {
    printf("Error writing data to a Seanet. \n");
  }
  pSeanet_local._4_4_ = (uint)(iVar1 != 0);
  return pSeanet_local._4_4_;
}

Assistant:

inline int SendDataRequestSeanet(SEANET* pSeanet)
{
	unsigned char reqbuf[] = {MESSAGE_HEADER_SEANET,'0','0','0','C',0x0C,0x00,
		SERIAL_PORT_PROGRAM_NODE_NUMBER_SEANET,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,
		0x07,mtSendData,0x80,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,0x00,0x00,0x00,0x00,MESSAGE_TERMINATOR_SEANET};

	// Send mtSendData message.
	if (WriteAllRS232Port(&pSeanet->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Seanet. \n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}